

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bottlecreatorgenerator.cpp
# Opt level: O0

void __thiscall
BottleCreatorGenerator::BottleCreatorGenerator
          (BottleCreatorGenerator *this,int numFields,double *rate_,bool toRos)

{
  ostream *this_00;
  bool toRos_local;
  double *rate__local;
  int numFields_local;
  BottleCreatorGenerator *this_local;
  
  YarpCodeGenerator::YarpCodeGenerator(&this->super_YarpCodeGenerator);
  (this->super_YarpCodeGenerator)._vptr_YarpCodeGenerator =
       (_func_int **)&PTR_generateCode_abi_cxx11__00145b58;
  this->numFields_ = numFields;
  this->listIndex_ = 0;
  this->toRos_ = toRos;
  std::vector<ChildGenerator,_std::allocator<ChildGenerator>_>::vector(&this->children_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->fieldsType_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->fieldsMsg_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->fieldsMux_);
  this->rate = *rate_;
  this->period = 1.0 / this->rate;
  this_00 = std::operator<<((ostream *)&std::cout,"Creating BottleCreatorGenerator.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

BottleCreatorGenerator::BottleCreatorGenerator(int numFields, const double & rate_, bool toRos) :
    numFields_(numFields),
    rate(rate_),
    period(1/rate),
    listIndex_(0),
    toRos_(toRos) {
    std::cout << "Creating BottleCreatorGenerator." << std::endl;
}